

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O3

void ffcprs(ParseData *lParse)

{
  iteratorCol *__ptr;
  DataInfo *pDVar1;
  void *pvVar2;
  Node *pNVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  __ptr = lParse->colData;
  if (lParse->nCols < 1) {
    if (__ptr != (iteratorCol *)0x0) {
      free(__ptr);
    }
  }
  else {
    if (__ptr == (iteratorCol *)0x0) {
      printf("invalid free(lParse->colData) at %s:%d\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
             ,0x3bc);
    }
    else {
      free(__ptr);
    }
    iVar4 = lParse->nCols;
    if (0 < iVar4) {
      lVar5 = 0;
      lVar6 = 0;
      do {
        pDVar1 = lParse->varData;
        if (*(long *)((long)pDVar1->naxes + lVar5 + 0x28) != 0) {
          if (*(int *)((long)pDVar1->naxes + lVar5 + -0x14) == 0x106) {
            pvVar2 = (void *)**(undefined8 **)((long)pDVar1->naxes + lVar5 + 0x30);
            if (pvVar2 == (void *)0x0) {
              printf("invalid free(((char**)lParse->varData[col].data)[0]) at %s:%d\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                     ,0x3c0);
            }
            else {
              free(pvVar2);
            }
          }
          free(*(void **)((long)lParse->varData->naxes + lVar5 + 0x28));
          iVar4 = lParse->nCols;
        }
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0xa0;
      } while (lVar6 < iVar4);
    }
    if (lParse->varData == (DataInfo *)0x0) {
      printf("invalid free(lParse->varData) at %s:%d\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
             ,0x3c3);
    }
    else {
      free(lParse->varData);
    }
    lParse->nCols = 0;
  }
  if (0 < (long)lParse->nNodes) {
    lVar5 = (long)lParse->nNodes * 0x180;
    do {
      pNVar3 = lParse->Nodes;
      iVar4 = *(int *)((long)pNVar3[-1].SubNodes + lVar5 + -0x14);
      if (iVar4 == 0x409) {
        fits_free_region((SAORegion *)
                         pNVar3[*(int *)((long)pNVar3 + lVar5 + -0x16c)].value.data.dblptr);
      }
      else if ((iVar4 == 0x408) &&
              (pvVar2 = pNVar3[*(int *)((long)pNVar3 + lVar5 + -0x16c)].value.data.ptr,
              pvVar2 != (void *)0x0)) {
        free(pvVar2);
      }
      lVar5 = lVar5 + -0x180;
    } while (lVar5 != 0);
    lParse->nNodes = 0;
  }
  if (lParse->Nodes != (Node *)0x0) {
    free(lParse->Nodes);
  }
  lParse->Nodes = (Node *)0x0;
  lParse->hdutype = -1;
  lParse->pixFilter = (PixelFilter *)0x0;
  lParse->nPrevDataRows = 0;
  lParse->nDataRows = 0;
  return;
}

Assistant:

void ffcprs( ParseData *lParse )
/*                                                                          */
/* Clear the parser, making it ready to accept a new expression.            */
/*--------------------------------------------------------------------------*/
{
   int col, node, i;

   if( lParse->nCols > 0 ) {
      FREE( lParse->colData  );
      for( col=0; col<lParse->nCols; col++ ) {
         if( lParse->varData[col].undef == NULL ) continue;
         if( lParse->varData[col].type  == BITSTR )
           FREE( ((char**)lParse->varData[col].data)[0] );
         free( lParse->varData[col].undef );
      }
      FREE( lParse->varData );
      lParse->nCols = 0;
   } else if ( lParse->colData ) {
     /* Special case if colData needed to be created with no columns */
     FREE( lParse->colData );
   }

   if( lParse->nNodes > 0 ) {
      node = lParse->nNodes;
      while( node-- ) {
         if( lParse->Nodes[node].operation==gtifilt_fct ) {
            i = lParse->Nodes[node].SubNodes[0];
            if (lParse->Nodes[ i ].value.data.ptr)
	        FREE( lParse->Nodes[ i ].value.data.ptr );
         }
         else if( lParse->Nodes[node].operation==regfilt_fct ) {
            i = lParse->Nodes[node].SubNodes[0];
            fits_free_region( (SAORegion *)lParse->Nodes[ i ].value.data.ptr );
         }
      }
      lParse->nNodes = 0;
   }
   if( lParse->Nodes ) free( lParse->Nodes );
   lParse->Nodes = NULL;

   lParse->hdutype = ANY_HDU;
   lParse->pixFilter = 0;
   lParse->nDataRows = lParse->nPrevDataRows = 0;
}